

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O1

bool __thiscall
cmCTestMemCheckHandler::ProcessMemCheckDrMemoryOutput
          (cmCTestMemCheckHandler *this,string *str,string *log,
          vector<int,_std::allocator<int>_> *results)

{
  int *piVar1;
  pointer pbVar2;
  bool bVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *l;
  pointer pbVar5;
  long lVar6;
  int iVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  RegularExpression handleLeak;
  RegularExpression leak;
  RegularExpression invalidHeapArgument;
  RegularExpression uninitializedRead;
  RegularExpression unaddressableAccess;
  RegularExpression drMemoryError;
  ostringstream ostr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6c8;
  long *local_6a8 [2];
  long local_698 [2];
  RegularExpression local_688;
  RegularExpression local_5b8;
  RegularExpression local_4e8;
  RegularExpression local_418;
  RegularExpression local_348;
  RegularExpression local_278;
  undefined1 local_1a8 [376];
  
  local_6c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmsys::SystemTools::Split(str,&local_6c8);
  local_278.regmust = (char *)0x0;
  local_278.program = (char *)0x0;
  local_278.progsize = 0;
  memset(&local_278,0,0xaa);
  cmsys::RegularExpression::compile(&local_278,"^Error #[0-9]+");
  local_348.regmust = (char *)0x0;
  local_348.program = (char *)0x0;
  local_348.progsize = 0;
  memset(&local_348,0,0xaa);
  cmsys::RegularExpression::compile(&local_348,"UNADDRESSABLE ACCESS");
  local_418.regmust = (char *)0x0;
  local_418.program = (char *)0x0;
  local_418.progsize = 0;
  memset(&local_418,0,0xaa);
  cmsys::RegularExpression::compile(&local_418,"UNINITIALIZED READ");
  local_4e8.regmust = (char *)0x0;
  local_4e8.program = (char *)0x0;
  local_4e8.progsize = 0;
  memset(&local_4e8,0,0xaa);
  cmsys::RegularExpression::compile(&local_4e8,"INVALID HEAP ARGUMENT");
  local_5b8.regmust = (char *)0x0;
  local_5b8.program = (char *)0x0;
  local_5b8.progsize = 0;
  memset(&local_5b8,0,0xaa);
  cmsys::RegularExpression::compile(&local_5b8,"LEAK");
  local_688.regmust = (char *)0x0;
  local_688.program = (char *)0x0;
  local_688.progsize = 0;
  memset(&local_688,0,0xaa);
  cmsys::RegularExpression::compile(&local_688,"HANDLE LEAK");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pbVar2 = local_6c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar7 = 0;
  if (local_6c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_6c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar5 = local_6c8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(pbVar5->_M_dataplus)._M_p,pbVar5->_M_string_length);
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      bVar3 = cmsys::RegularExpression::find
                        (&local_278,(pbVar5->_M_dataplus)._M_p,&local_278.regmatch);
      if (bVar3) {
        bVar3 = cmsys::RegularExpression::find
                          (&local_348,(pbVar5->_M_dataplus)._M_p,&local_348.regmatch);
        iVar7 = iVar7 + 1;
        lVar6 = 0x54;
        if (!bVar3) {
          bVar3 = cmsys::RegularExpression::find
                            (&local_418,(pbVar5->_M_dataplus)._M_p,&local_418.regmatch);
          if (!bVar3) {
            bVar3 = cmsys::RegularExpression::find
                              (&local_5b8,(pbVar5->_M_dataplus)._M_p,&local_5b8.regmatch);
            lVar6 = 0x38;
            if (!bVar3) {
              bVar3 = cmsys::RegularExpression::find
                                (&local_688,(pbVar5->_M_dataplus)._M_p,&local_688.regmatch);
              if (!bVar3) {
                bVar3 = cmsys::RegularExpression::find
                                  (&local_4e8,(pbVar5->_M_dataplus)._M_p,&local_4e8.regmatch);
                lVar6 = 0x1c;
                if (!bVar3) goto LAB_001cc012;
              }
            }
          }
        }
        piVar1 = (int *)((long)(results->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar6);
        *piVar1 = *piVar1 + 1;
      }
LAB_001cc012:
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != pbVar2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)log,(string *)local_6a8);
  if (local_6a8[0] != local_698) {
    operator_delete(local_6a8[0],local_698[0] + 1);
  }
  this->DefectCount = this->DefectCount + iVar7;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  if (local_688.program != (char *)0x0) {
    operator_delete__(local_688.program);
  }
  if (local_5b8.program != (char *)0x0) {
    operator_delete__(local_5b8.program);
  }
  if (local_4e8.program != (char *)0x0) {
    operator_delete__(local_4e8.program);
  }
  if (local_418.program != (char *)0x0) {
    operator_delete__(local_418.program);
  }
  if (local_348.program != (char *)0x0) {
    operator_delete__(local_348.program);
  }
  if (local_278.program != (char *)0x0) {
    operator_delete__(local_278.program);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_6c8);
  return iVar7 == 0;
}

Assistant:

bool cmCTestMemCheckHandler::ProcessMemCheckDrMemoryOutput(
  const std::string& str, std::string& log, std::vector<int>& results)
{
  std::vector<std::string> lines;
  cmsys::SystemTools::Split(str, lines);

  cmsys::RegularExpression drMemoryError("^Error #[0-9]+");

  cmsys::RegularExpression unaddressableAccess("UNADDRESSABLE ACCESS");
  cmsys::RegularExpression uninitializedRead("UNINITIALIZED READ");
  cmsys::RegularExpression invalidHeapArgument("INVALID HEAP ARGUMENT");
  cmsys::RegularExpression leak("LEAK");
  cmsys::RegularExpression handleLeak("HANDLE LEAK");

  int defects = 0;

  std::ostringstream ostr;
  for (const auto& l : lines) {
    ostr << l << std::endl;
    if (drMemoryError.find(l)) {
      defects++;
      if (unaddressableAccess.find(l) || uninitializedRead.find(l)) {
        results[cmCTestMemCheckHandler::UMR]++;
      } else if (leak.find(l) || handleLeak.find(l)) {
        results[cmCTestMemCheckHandler::MLK]++;
      } else if (invalidHeapArgument.find(l)) {
        results[cmCTestMemCheckHandler::FMM]++;
      }
    }
  }

  log = ostr.str();

  this->DefectCount += defects;
  return defects == 0;
}